

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-signal.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  int sig;
  char **argv_local;
  int argc_local;
  
  if (argc != 2) {
    exit(1);
  }
  uVar1 = atoi(argv[1]);
  if (uVar1 != 0) {
    switch(uVar1) {
    case 1:
      fprintf(_stdout,"SIGHUP\n");
      break;
    case 2:
      fprintf(_stdout,"User interrupt\n");
      break;
    case 3:
      fprintf(_stdout,"SIGQUIT\n");
      break;
    case 4:
      fprintf(_stdout,"Illegal instruction\n");
      break;
    case 5:
      fprintf(_stdout,"SIGTRAP\n");
      break;
    case 6:
      fprintf(_stdout,"Subprocess aborted\nChild aborted\n");
      break;
    case 7:
      fprintf(_stdout,"Bus error\n");
      break;
    case 8:
      fprintf(_stdout,"Floating-point exception\n");
      break;
    case 9:
      fprintf(_stdout,"Subprocess killed\nChild killed\n");
      break;
    case 10:
      fprintf(_stdout,"SIGUSR1\n");
      break;
    case 0xb:
      fprintf(_stdout,"Segmentation fault\n");
      break;
    case 0xc:
      fprintf(_stdout,"SIGUSR2\n");
      break;
    case 0xd:
      fprintf(_stdout,"SIGPIPE\n");
      break;
    case 0xe:
      fprintf(_stdout,"SIGALRM\n");
      break;
    case 0xf:
      fprintf(_stdout,"Subprocess terminated\nChild terminated\n");
      break;
    case 0x10:
      fprintf(_stdout,"SIGSTKFLT\n");
      break;
    case 0x11:
      fprintf(_stdout,"SIGCHLD\n");
      break;
    case 0x12:
      fprintf(_stdout,"SIGCONT\n");
      break;
    case 0x13:
      fprintf(_stdout,"SIGSTOP\n");
      break;
    case 0x14:
      fprintf(_stdout,"SIGTSTP\n");
      break;
    case 0x15:
      fprintf(_stdout,"SIGTTIN\n");
      break;
    case 0x16:
      fprintf(_stdout,"SIGTTOU\n");
      break;
    case 0x17:
      fprintf(_stdout,"SIGURG\n");
      break;
    case 0x18:
      fprintf(_stdout,"SIGXCPU\n");
      break;
    case 0x19:
      fprintf(_stdout,"SIGXFSZ\n");
      break;
    case 0x1a:
      fprintf(_stdout,"SIGVTALRM\n");
      break;
    case 0x1b:
      fprintf(_stdout,"SIGPROF\n");
      break;
    case 0x1c:
      fprintf(_stdout,"SIGWINCH\n");
      break;
    case 0x1d:
      fprintf(_stdout,"SIGPOLL\n");
      break;
    case 0x1e:
      fprintf(_stdout,"SIGPWR\n");
      break;
    case 0x1f:
      fprintf(_stdout,"SIGSYS\n");
      break;
    default:
      fprintf(_stdout,"Signal %d\n",(ulong)uVar1);
    }
    fflush(_stdout);
    return 0;
  }
  exit(1);
}

Assistant:

int
main(int argc, char **argv)
{
	if (argc != 2) {
		exit(1);
	}

	int sig = atoi(argv[1]);
	if (sig == 0) {
		exit(1);
	}

	switch (sig) {
#ifdef SIGSEGV
	case SIGSEGV:
		fprintf(stdout, "Segmentation fault\n");
		break;
#endif
#ifdef SIGBUS
#if !defined(SIGSEGV) || SIGBUS != SIGSEGV
	case SIGBUS:
		fprintf(stdout, "Bus error\n");
		break;
#endif
#endif
#ifdef SIGFPE
	case SIGFPE:
		fprintf(stdout, "Floating-point exception\n");
		break;
#endif
#ifdef SIGILL
	case SIGILL:
		fprintf(stdout, "Illegal instruction\n");
		break;
#endif
#ifdef SIGINT
	case SIGINT:
		fprintf(stdout, "User interrupt\n");
		break;
#endif
#ifdef SIGABRT
	case SIGABRT:
		fprintf(stdout, "Subprocess aborted\nChild aborted\n");
		break;
#endif
#ifdef SIGKILL
	case SIGKILL:
		fprintf(stdout, "Subprocess killed\nChild killed\n");
		break;
#endif
#ifdef SIGTERM
	case SIGTERM:
		fprintf(stdout, "Subprocess terminated\nChild terminated\n");
		break;
#endif
#ifdef SIGHUP
	case SIGHUP:
		fprintf(stdout, "SIGHUP\n");
		break;
#endif
#ifdef SIGQUIT
	case SIGQUIT:
		fprintf(stdout, "SIGQUIT\n");
		break;
#endif
#ifdef SIGTRAP
	case SIGTRAP:
		fprintf(stdout, "SIGTRAP\n");
		break;
#endif
#ifdef SIGIOT
#if !defined(SIGABRT) || SIGIOT != SIGABRT
	case SIGIOT:
		fprintf(stdout, "SIGIOT\n");
		break;
#endif
#endif
#ifdef SIGUSR1
	case SIGUSR1:
		fprintf(stdout, "SIGUSR1\n");
		break;
#endif
#ifdef SIGUSR2
	case SIGUSR2:
		fprintf(stdout, "SIGUSR2\n");
		break;
#endif
#ifdef SIGPIPE
	case SIGPIPE:
		fprintf(stdout, "SIGPIPE\n");
		break;
#endif
#ifdef SIGALRM
	case SIGALRM:
		fprintf(stdout, "SIGALRM\n");
		break;
#endif
#ifdef SIGSTKFLT
	case SIGSTKFLT:
		fprintf(stdout, "SIGSTKFLT\n");
		break;
#endif
#ifdef SIGCHLD
	case SIGCHLD:
		fprintf(stdout, "SIGCHLD\n");
		break;
#elif defined(SIGCLD)
	case SIGCLD:
		fprintf(stdout, "SIGCLD\n");
		break;
#endif
#ifdef SIGCONT
	case SIGCONT:
		fprintf(stdout, "SIGCONT\n");
		break;
#endif
#ifdef SIGSTOP
	case SIGSTOP:
		fprintf(stdout, "SIGSTOP\n");
		break;
#endif
#ifdef SIGTSTP
	case SIGTSTP:
		fprintf(stdout, "SIGTSTP\n");
		break;
#endif
#ifdef SIGTTIN
	case SIGTTIN:
		fprintf(stdout, "SIGTTIN\n");
		break;
#endif
#ifdef SIGTTOU
	case SIGTTOU:
		fprintf(stdout, "SIGTTOU\n");
		break;
#endif
#ifdef SIGURG
	case SIGURG:
		fprintf(stdout, "SIGURG\n");
		break;
#endif
#ifdef SIGXCPU
	case SIGXCPU:
		fprintf(stdout, "SIGXCPU\n");
		break;
#endif
#ifdef SIGXFSZ
	case SIGXFSZ:
		fprintf(stdout, "SIGXFSZ\n");
		break;
#endif
#ifdef SIGVTALRM
	case SIGVTALRM:
		fprintf(stdout, "SIGVTALRM\n");
		break;
#endif
#ifdef SIGPROF
	case SIGPROF:
		fprintf(stdout, "SIGPROF\n");
		break;
#endif
#ifdef SIGWINCH
	case SIGWINCH:
		fprintf(stdout, "SIGWINCH\n");
		break;
#endif
#ifdef SIGPOLL
	case SIGPOLL:
		fprintf(stdout, "SIGPOLL\n");
		break;
#endif
#ifdef SIGIO
#if !defined(SIGPOLL) || SIGIO != SIGPOLL
	case SIGIO:
		fprintf(stdout, "SIGIO\n");
		break;
#endif
#endif
#ifdef SIGPWR
	case SIGPWR:
		fprintf(stdout, "SIGPWR\n");
		break;
#endif
#ifdef SIGSYS
	case SIGSYS:
		fprintf(stdout, "SIGSYS\n");
		break;
#endif
#ifdef SIGUNUSED
#if !defined(SIGSYS) || SIGUNUSED != SIGSYS
	case SIGUNUSED:
		fprintf(stdout, "SIGUNUSED\n");
		break;
#endif
#endif
	default:
		fprintf(stdout, "Signal %d\n", sig);
		break;
	}

	fflush(stdout);
}